

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

int xmlBufferGrow(xmlBufferPtr buf,uint len)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  xmlChar *pxVar4;
  size_t sVar5;
  char *extra;
  long lVar6;
  
  if (buf == (xmlBufferPtr)0x0) {
    return -1;
  }
  if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) {
    return 0;
  }
  uVar1 = buf->use;
  uVar2 = buf->size;
  if (len < uVar2 - uVar1) {
    return 0;
  }
  if (len < ~uVar1) {
    if (len < uVar2) {
      sVar5 = 0xffffffff;
      if (-1 < (int)uVar2) {
        sVar5 = (size_t)(uVar2 * 2);
      }
    }
    else {
      sVar5 = 0xffffffff;
      if (uVar1 + len < 0xffffff9c) {
        sVar5 = (size_t)(uVar1 + len + 100);
      }
    }
    if ((buf->alloc == XML_BUFFER_ALLOC_IO) && (pxVar4 = buf->contentIO, pxVar4 != (xmlChar *)0x0))
    {
      lVar6 = (long)buf->content - (long)pxVar4;
      pxVar4 = (xmlChar *)(*xmlRealloc)(pxVar4,sVar5 + lVar6);
      if (pxVar4 == (xmlChar *)0x0) {
        __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"growing buffer");
        return -1;
      }
      buf->contentIO = pxVar4;
      buf->content = pxVar4 + lVar6;
    }
    else {
      pxVar4 = (xmlChar *)(*xmlRealloc)(buf->content,sVar5);
      if (pxVar4 == (xmlChar *)0x0) {
        extra = "growing buffer";
        goto LAB_001884d8;
      }
      buf->content = pxVar4;
    }
    buf->size = (uint)sVar5;
    iVar3 = ~buf->use + (uint)sVar5;
  }
  else {
    extra = "growing buffer past UINT_MAX";
LAB_001884d8:
    __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,extra);
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int
xmlBufferGrow(xmlBufferPtr buf, unsigned int len) {
    unsigned int size;
    xmlChar *newbuf;

    if (buf == NULL) return(-1);

    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) return(0);
    if (len < buf->size - buf->use)
        return(0);
    if (len >= UINT_MAX - buf->use) {
        xmlTreeErrMemory("growing buffer past UINT_MAX");
        return(-1);
    }

    if (buf->size > (size_t) len) {
        size = buf->size > UINT_MAX / 2 ? UINT_MAX : buf->size * 2;
    } else {
        size = buf->use + len;
        size = size > UINT_MAX - 100 ? UINT_MAX : size + 100;
    }

    if ((buf->alloc == XML_BUFFER_ALLOC_IO) && (buf->contentIO != NULL)) {
        size_t start_buf = buf->content - buf->contentIO;

	newbuf = (xmlChar *) xmlRealloc(buf->contentIO, start_buf + size);
	if (newbuf == NULL) {
	    xmlTreeErrMemory("growing buffer");
	    return(-1);
	}
	buf->contentIO = newbuf;
	buf->content = newbuf + start_buf;
    } else {
	newbuf = (xmlChar *) xmlRealloc(buf->content, size);
	if (newbuf == NULL) {
	    xmlTreeErrMemory("growing buffer");
	    return(-1);
	}
	buf->content = newbuf;
    }
    buf->size = size;
    return(buf->size - buf->use - 1);
}